

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  slot_type *psVar3;
  ulong uVar4;
  ctrl_t *pcVar5;
  slot_type *psVar6;
  undefined1 auVar7 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  undefined8 uVar23;
  unsigned_long uVar24;
  unsigned_long uVar25;
  unsigned_long uVar26;
  ctrl_t *pcVar27;
  size_t i;
  ulong uVar28;
  ulong uVar29;
  byte bVar30;
  size_t i_00;
  FindInfo FVar31;
  
  uVar4 = this->capacity_;
  if (uVar4 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar4 + 1 & uVar4) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x288,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar4 - (uVar4 >> 3) >> 1 < this->size_) {
    resize(this,uVar4 * 2 + 1);
    return;
  }
  uVar4 = this->capacity_;
  if ((uVar4 == 0) || ((uVar4 + 1 & uVar4) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
                 );
  }
  if (uVar4 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
                 );
  }
  pcVar5 = this->ctrl_;
  if (pcVar5[uVar4] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar27 = pcVar5 + uVar4;
  if (pcVar27 + 1 != pcVar5) {
    uVar29 = 0;
    do {
      pcVar1 = pcVar5 + uVar29;
      cVar8 = pcVar1[1];
      cVar9 = pcVar1[2];
      cVar10 = pcVar1[3];
      cVar11 = pcVar1[4];
      cVar12 = pcVar1[5];
      cVar13 = pcVar1[6];
      cVar14 = pcVar1[7];
      cVar15 = pcVar1[8];
      cVar16 = pcVar1[9];
      cVar17 = pcVar1[10];
      cVar18 = pcVar1[0xb];
      cVar19 = pcVar1[0xc];
      cVar20 = pcVar1[0xd];
      cVar21 = pcVar1[0xe];
      cVar22 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar5 + uVar29);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      uVar29 = uVar29 + 0x10;
    } while (uVar4 + 1 != uVar29);
  }
  uVar23 = *(undefined8 *)(pcVar5 + 8);
  *(undefined8 *)(pcVar27 + 1) = *(undefined8 *)pcVar5;
  *(undefined8 *)(pcVar27 + 9) = uVar23;
  *pcVar27 = -1;
  if (this->capacity_ == 0) {
    i_00 = 0;
  }
  else {
    i_00 = 0;
    do {
      if (this->ctrl_[i_00] == -2) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = this->slots_[i_00].value.first;
        uVar29 = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar7,8) +
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar7,0);
        FVar31 = find_first_non_full(this,uVar29);
        i = FVar31.offset;
        uVar4 = this->capacity_;
        if ((uVar4 + 1 & uVar4) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar28 = uVar29 >> 7 & uVar4;
        bVar30 = (byte)uVar29;
        if (((i_00 - uVar28 ^ i - uVar28) & uVar4) < 0x10) {
          bVar30 = bVar30 & 0x7f;
        }
        else {
          if (this->ctrl_[i] == -2) {
            set_ctrl(this,i,bVar30 & 0x7f);
            psVar6 = this->slots_;
            uVar24 = psVar6[i_00].value.first;
            uVar25 = psVar6[i_00].value.second;
            uVar26 = psVar6[i].value.second;
            psVar6[i_00].value.first = psVar6[i].value.first;
            psVar6[i_00].value.second = uVar26;
            psVar6 = this->slots_;
            psVar6[i].value.first = uVar24;
            psVar6[i].value.second = uVar25;
            i_00 = i_00 - 1;
            goto LAB_001772ee;
          }
          if (this->ctrl_[i] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
                         );
          }
          set_ctrl(this,i,bVar30 & 0x7f);
          psVar6 = this->slots_ + i_00;
          uVar24 = (psVar6->value).second;
          psVar3 = this->slots_ + i;
          (psVar3->value).first = (psVar6->value).first;
          (psVar3->value).second = uVar24;
          bVar30 = 0x80;
        }
        set_ctrl(this,i_00,bVar30);
      }
LAB_001772ee:
      i_00 = i_00 + 1;
    } while (i_00 != this->capacity_);
  }
  reset_growth_left(this,i_00);
  return;
}

Assistant:

void rehash_and_grow_if_necessary()
			{
				if (capacity_ == 0) {
					resize(1);
				}
				else if (size() <= CapacityToGrowth(capacity()) / 2) {
					// Squash DELETED without growing if there is enough capacity.
					drop_deletes_without_resize();
				}
				else {
					// Otherwise grow the container.
					resize(capacity_ * 2 + 1);
				}
			}